

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O2

CoAlg<string> *
coalg::decode_pattern
          (CoAlg<string> *__return_storage_ptr__,NS *g,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
          *chrs)

{
  undefined8 *puVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
  local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
  ::_Rb_tree(&local_48,&chrs->_M_t);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = g;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(puVar1 + 2),&local_48._M_impl.super__Rb_tree_header);
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/N.cpp:74:16)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/N.cpp:74:16)>
       ::_M_manager;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_N_*>_>_>
  ::~_Rb_tree(&local_48);
  return __return_storage_ptr__;
}

Assistant:

CoAlg<string> decode_pattern(NS* g, map<std::string, N*>& chrs) {
        return [g, chrs](string& p){
            if (p.empty()) return new(g) N("");
            else if (std::isalnum(p[0])) {
                const auto c = string(1, p[0]);
                auto cur = new(g) N("term-" + c);
                cur->connect(chrs.at(c), {new (g) N(p.substr(1))});
                return cur;
            } else if (p[0] == '.') {
                auto cur = new(g) N("any");
                for (auto& [c, n] : chrs)
                    cur->connect(n, {new (g) N(p.substr(1))});
                return cur;
            } else if (p[0] == '(' and p.find(')') != string::npos) {
                auto k = p.find_first_of(')');
                auto cur = new(g) N("group-" + p.substr(1, k - 1));
                return cur;
            } else {
                return new (g) N("Error");
            }
        };
    }